

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtaudio_c.cpp
# Opt level: O2

rtaudio_api_t rtaudio_compiled_api_by_name(char *name)

{
  Api AVar1;
  allocator local_29;
  string local_28;
  
  if (name == (char *)0x0) {
    AVar1 = UNSPECIFIED;
  }
  else {
    std::__cxx11::string::string((string *)&local_28,name,&local_29);
    AVar1 = RtAudio::getCompiledApiByName(&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return AVar1;
}

Assistant:

rtaudio_api_t rtaudio_compiled_api_by_name(const char *name) {
  RtAudio::Api api = RtAudio::UNSPECIFIED;
  if (name) {
    api = RtAudio::getCompiledApiByName(name);
  }
  return (rtaudio_api_t)api;
}